

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void ClearShrink<std::deque<int,std::allocator<int>>>(deque<int,_std::allocator<int>_> *v)

{
  long lVar1;
  deque<int,_std::allocator<int>_> *in_RDI;
  long in_FS_OFFSET;
  deque<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  deque<int,_std::allocator<int>_> *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (deque<int,_std::allocator<int>_> *)0x0;
  std::deque<int,_std::allocator<int>_>::deque(in_stack_ffffffffffffff98);
  std::deque<int,_std::allocator<int>_>::swap(this,in_RDI);
  std::deque<int,_std::allocator<int>_>::~deque(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ClearShrink(V& v) noexcept
{
    // There are various ways to clear a vector and release its memory:
    //
    // 1. V{}.swap(v)
    // 2. v = V{}
    // 3. v = {}; v.shrink_to_fit();
    // 4. v.clear(); v.shrink_to_fit();
    //
    // (2) does not appear to release memory in glibc debug mode, even if v.shrink_to_fit()
    // follows. (3) and (4) rely on std::vector::shrink_to_fit, which is only a non-binding
    // request. Therefore, we use method (1).

    V{}.swap(v);
}